

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_zhao_2010.h
# Opt level: O1

void __thiscall SBLA::SecondScan(SBLA *this)

{
  uint *puVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  
  if (0 < this->N * this->M) {
    lVar4 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    lVar6 = 0;
    do {
      iVar8 = *(int *)(lVar4 + lVar6 * 4);
      if (iVar8 < 0) {
        do {
          uVar7 = (ulong)(uint)-iVar8;
          iVar3 = *(int *)(lVar4 + uVar7 * 4);
          if (iVar8 == iVar3) break;
          iVar8 = iVar3;
        } while (iVar3 < 0);
        if (iVar3 < 0) {
          uVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
          (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
          *(uint *)(lVar4 + uVar7 * 4) = uVar9;
        }
        *(undefined4 *)(lVar4 + lVar6 * 4) = *(undefined4 *)(lVar4 + uVar7 * 4);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (long)this->N * (long)this->M);
  }
  cVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74;
  if (cVar2 != '\0') {
    **(char **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10 = cVar2;
    if (1 < this->N) {
      pcVar5 = *(char **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x10;
      cVar2 = pcVar5[1];
      if (cVar2 != '\0') {
        *pcVar5 = cVar2;
        goto LAB_001d9eab;
      }
    }
    if (1 < this->M) {
      pcVar5 = *(char **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x10;
      cVar2 = pcVar5[**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                 field_0x48];
      if (cVar2 != '\0') {
        *pcVar5 = cVar2;
        goto LAB_001d9eab;
      }
    }
    if (1 < this->N && 1 < this->M) {
      pcVar5 = *(char **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x10;
      cVar2 = pcVar5[**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                 field_0x48 + 1];
      if (cVar2 != '\0') {
        *pcVar5 = cVar2;
        goto LAB_001d9eab;
      }
    }
    **(undefined1 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10 =
         1;
  }
LAB_001d9eab:
  puVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void SecondScan()
    {
        // Label assignment
        int *img_labelsdata = reinterpret_cast<int*>(img_labels_.data);
        for (int i = 0; i < M * N; ++i) {
            // FindRoot_GetLabel
            int pos = img_labelsdata[i];
            if (pos >= 0)
                continue;

            int tmp;
            while (true) {
                tmp = img_labelsdata[-pos];
                if (pos == tmp || tmp >= 0)
                    break;
                pos = tmp;
            }
            if (tmp < 0)
                img_labelsdata[-pos] = ++n_labels_;

            // Assign final label
            img_labelsdata[i] = img_labelsdata[-pos];
        }

        // Fix for first pixel!
        if (firstpixel) {
            const_cast<cv::Mat1b&>(img_).data[0] = firstpixel;
            if (N > 1 && img_labels_.data[1])
                img_labels_.data[0] = img_labels_.data[1];
            else if (M > 1 && img_labels_.data[img_.step[0]])
                img_labels_.data[0] = img_labels_.data[img_.step[0]];
            else if (N > 1 && M > 1 && img_labels_.data[img_.step[0] + 1])
                img_labels_.data[0] = img_labels_.data[img_.step[0] + 1];
            else
                img_labels_.data[0] = 1;
        }

        n_labels_++; // To count also background
    }